

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_bss_decoder.hpp
# Opt level: O1

void __thiscall
duckdb::BssDecoder::GetBatch<double>
          (BssDecoder *this,data_ptr_t values_target_ptr,uint32_t batch_size)

{
  uint uVar1;
  ulong uVar2;
  data_ptr_t pdVar3;
  ostream *poVar4;
  runtime_error *this_00;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  stringstream error;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  uVar2 = (this->buffer_).len;
  if ((uVar2 & 7) == 0) {
    ByteBuffer::available(&this->buffer_,(ulong)(this->value_offset_ + batch_size) << 3);
    uVar5 = 0;
    lVar6 = 0;
    do {
      if (batch_size != 0) {
        uVar1 = this->value_offset_;
        pdVar3 = (this->buffer_).ptr;
        uVar7 = 0;
        do {
          values_target_ptr[uVar7 * 8] = pdVar3[uVar7 + (ulong)uVar1 + (ulong)uVar5];
          uVar7 = uVar7 + 1;
        } while (batch_size != uVar7);
      }
      lVar6 = lVar6 + 1;
      uVar5 = uVar5 + (int)(uVar2 >> 3);
      values_target_ptr = values_target_ptr + 1;
    } while (lVar6 != 8);
    this->value_offset_ = this->value_offset_ + batch_size;
    return;
  }
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"Data buffer size for the BYTE_STREAM_SPLIT encoding (",0x35);
  poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,") should be a multiple of the type size (",0x29);
  poVar4 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::stringbuf::str();
  ::std::runtime_error::runtime_error(this_00,asStack_1c8);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void GetBatch(data_ptr_t values_target_ptr, uint32_t batch_size) {
		if (buffer_.len % sizeof(T) != 0) {
			std::stringstream error;
			error << "Data buffer size for the BYTE_STREAM_SPLIT encoding (" << buffer_.len
			      << ") should be a multiple of the type size (" << sizeof(T) << ")";
			throw std::runtime_error(error.str());
		}
		uint32_t num_buffer_values = buffer_.len / sizeof(T);

		buffer_.available((value_offset_ + batch_size) * sizeof(T));

		for (uint32_t byte_offset = 0; byte_offset < sizeof(T); ++byte_offset) {
			data_ptr_t input_bytes = buffer_.ptr + byte_offset * num_buffer_values + value_offset_;
			for (uint32_t i = 0; i < batch_size; ++i) {
				values_target_ptr[byte_offset + i * sizeof(T)] = *(input_bytes + i);
			}
		}
		value_offset_ += batch_size;
	}